

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  ImGuiTextBuffer *this;
  char *pcVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  ImGuiSettingsHandler *pIVar4;
  char *pcVar5;
  int handler_n;
  int iVar6;
  char local_29;
  
  pIVar2 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  this = &pIVar2->SettingsIniData;
  ImVector<char>::resize(&this->Buf,0);
  local_29 = '\0';
  ImVector<char>::push_back(&this->Buf,&local_29);
  for (iVar6 = 0; iVar6 < (pIVar2->SettingsHandlers).Size; iVar6 = iVar6 + 1) {
    pIVar4 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar2->SettingsHandlers,iVar6);
    (*pIVar4->WriteAllFn)(pIVar2,pIVar4,this);
  }
  if (out_size != (size_t *)0x0) {
    iVar6 = (this->Buf).Size;
    iVar3 = iVar6 + -1;
    if (iVar6 == 0) {
      iVar3 = 0;
    }
    *out_size = (long)iVar3;
  }
  pcVar1 = (pIVar2->SettingsIniData).Buf.Data;
  pcVar5 = ImGuiTextBuffer::EmptyString;
  if (pcVar1 != (char *)0x0) {
    pcVar5 = pcVar1;
  }
  return pcVar5;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
    {
        ImGuiSettingsHandler* handler = &g.SettingsHandlers[handler_n];
        handler->WriteAllFn(&g, handler, &g.SettingsIniData);
    }
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}